

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_ratelimit(Curl_easy *data,curltime now)

{
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  timediff_t tVar6;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  auVar1 = now._0_12_;
  if ((data->set).max_recv_speed != 0) {
    uVar2 = (data->progress).dl_limit_start.tv_sec;
    uVar3 = (data->progress).dl_limit_start.tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    newer._12_4_ = 0;
    newer.tv_sec = auVar1._0_8_;
    newer.tv_usec = auVar1._8_4_;
    older._12_4_ = 0;
    tVar6 = Curl_timediff(newer,older);
    if (2999 < tVar6) {
      (data->progress).dl_limit_start.tv_sec = now.tv_sec;
      (data->progress).dl_limit_start.tv_usec = now.tv_usec;
      (data->progress).dl_limit_size = (data->progress).downloaded;
    }
  }
  if ((data->set).max_send_speed != 0) {
    uVar4 = (data->progress).ul_limit_start.tv_sec;
    uVar5 = (data->progress).ul_limit_start.tv_usec;
    older_00.tv_usec = uVar5;
    older_00.tv_sec = uVar4;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = auVar1._0_8_;
    newer_00.tv_usec = auVar1._8_4_;
    older_00._12_4_ = 0;
    tVar6 = Curl_timediff(newer_00,older_00);
    if (2999 < tVar6) {
      (data->progress).ul_limit_start.tv_sec = now.tv_sec;
      (data->progress).ul_limit_start.tv_usec = now.tv_usec;
      (data->progress).ul_limit_size = (data->progress).uploaded;
    }
  }
  return;
}

Assistant:

void Curl_ratelimit(struct Curl_easy *data, struct curltime now)
{
  /* don't set a new stamp unless the time since last update is long enough */
  if(data->set.max_recv_speed) {
    if(Curl_timediff(now, data->progress.dl_limit_start) >=
       MIN_RATE_LIMIT_PERIOD) {
      data->progress.dl_limit_start = now;
      data->progress.dl_limit_size = data->progress.downloaded;
    }
  }
  if(data->set.max_send_speed) {
    if(Curl_timediff(now, data->progress.ul_limit_start) >=
       MIN_RATE_LIMIT_PERIOD) {
      data->progress.ul_limit_start = now;
      data->progress.ul_limit_size = data->progress.uploaded;
    }
  }
}